

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended-kalman-filter.cpp
# Opt level: O0

Amatrix * __thiscall
stateObservation::ExtendedKalmanFilter::getAMatrixFD
          (Amatrix *__return_storage_ptr__,ExtendedKalmanFilter *this,Vector *dx)

{
  double dVar1;
  StateVectorArithmetics *pSVar2;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar3;
  CoeffReturnType pdVar4;
  Scalar *pSVar5;
  ColXpr local_98;
  Matrix<double,__1,_1,_0,__1,_1> local_60;
  long local_50;
  Index i;
  undefined1 local_38 [24];
  TimeIndex k;
  Vector *dx_local;
  ExtendedKalmanFilter *this_local;
  
  k = (TimeIndex)dx;
  dx_local = (Vector *)this;
  this_local = (ExtendedKalmanFilter *)__return_storage_ptr__;
  local_38._16_8_ =
       IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::getTime
                 (&(this->super_KalmanFilterBase).super_ZeroDelayObserver.x_);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&(this->opt).a_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
             (this->super_KalmanFilterBase).nt_,(this->super_KalmanFilterBase).nt_);
  KalmanFilterBase::updateStatePrediction((KalmanFilterBase *)local_38);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_38);
  pMVar3 = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::operator()
                     (&(this->super_KalmanFilterBase).super_ZeroDelayObserver.x_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(&(this->opt).x_,pMVar3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->opt).dx_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (this->super_KalmanFilterBase).nt_);
  if (0 < (this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.p_) {
    if ((this->directInputStateProcessFeedthrough_ & 1U) == 0) {
      (*(this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase._vptr_ObserverBase
        [0x1b])(&i);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
                (&(this->opt).u_,(Matrix<double,__1,_1,_0,__1,_1> *)&i);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&i);
    }
    else {
      pMVar3 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
               ::operator[](&(this->super_KalmanFilterBase).super_ZeroDelayObserver.u_,
                            local_38._16_8_);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(&(this->opt).u_,pMVar3);
    }
  }
  for (local_50 = 0; local_50 < (this->super_KalmanFilterBase).nt_; local_50 = local_50 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&(this->opt).dx_);
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)k,local_50);
    dVar1 = *pdVar4;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &(this->opt).dx_,local_50);
    *pSVar5 = dVar1;
    pSVar2 = (this->super_KalmanFilterBase).arithm_;
    pMVar3 = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::operator()
                       (&(this->super_KalmanFilterBase).super_ZeroDelayObserver.x_);
    (**pSVar2->_vptr_StateVectorArithmetics)(pSVar2,pMVar3,&(this->opt).dx_,&(this->opt).x_);
    (*this->f_->_vptr_DynamicalSystemFunctorBase[2])
              (&local_60,this->f_,&(this->opt).x_,&this->opt,local_38._16_8_);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(&(this->opt).xp_,&local_60);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_60);
    pSVar2 = (this->super_KalmanFilterBase).arithm_;
    pMVar3 = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::operator()
                       (&(this->super_KalmanFilterBase).xbar_);
    (*pSVar2->_vptr_StateVectorArithmetics[1])(pSVar2,&(this->opt).xp_,pMVar3,&(this->opt).dx_);
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)k,local_50);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&(this->opt).dx_,pdVar4);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_98,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&(this->opt).a_,
               local_50);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)&local_98,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&(this->opt).dx_);
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(__return_storage_ptr__,&(this->opt).a_);
  return __return_storage_ptr__;
}

Assistant:

KalmanFilterBase::Amatrix // ExtendedKalmanFilter<n,m,p>::Amatrix does not work
    ExtendedKalmanFilter::getAMatrixFD(const Vector & dx)
{
  TimeIndex k = this->x_.getTime();
  opt.a_.resize(nt_, nt_);
  updateStatePrediction();

  opt.x_ = this->x_();
  opt.dx_.resize(nt_);

  if(p_ > 0)
  {
    if(directInputStateProcessFeedthrough_)
      opt.u_ = this->u_[k];
    else
      opt.u_ = inputVectorZero();
  }

  for(Index i = 0; i < nt_; ++i)
  {

    opt.dx_.setZero();
    opt.dx_[i] = dx[i];

    arithm_->stateSum(this->x_(), opt.dx_, opt.x_);

    opt.xp_ = f_->stateDynamics(opt.x_, opt.u_, k);

    arithm_->stateDifference(opt.xp_, xbar_(), opt.dx_);

    opt.dx_ /= dx[i];

    opt.a_.col(i) = opt.dx_;
  }

  return opt.a_;
}